

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall pbrt::ScratchBuffer::ScratchBuffer(ScratchBuffer *this,int size)

{
  void *pvVar1;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  polymorphic_allocator<std::byte> *this_00;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  this_00 = (polymorphic_allocator<std::byte> *)(in_RDI + 2);
  std::__cxx11::
  list<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>::list
            ((list<std::pair<char_*,_unsigned_long>,_std::allocator<std::pair<char_*,_unsigned_long>_>_>
              *)0x82b979);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(this_00);
  pvVar1 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_bytes
                     (this_00,(size_t)in_RDI,0x82b99c);
  *in_RDI = pvVar1;
  return;
}

Assistant:

ScratchBuffer(int size = 256) : allocSize(size) {
        ptr = (char *)Allocator().allocate_bytes(size, align);
    }